

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_1::AttachmentTextureColorCodingCase::test
          (AttachmentTextureColorCodingCase *this)

{
  CallLogWrapper *testCtx;
  GLuint GVar1;
  GLenum in_R9D;
  GLuint renderbufferID;
  GLuint framebufferID;
  
  framebufferID = 0;
  testCtx = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGenFramebuffers(testCtx,1,&framebufferID);
  glu::CallLogWrapper::glBindFramebuffer(testCtx,0x8d40,framebufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  renderbufferID = 0;
  glu::CallLogWrapper::glGenRenderbuffers(testCtx,1,&renderbufferID);
  glu::CallLogWrapper::glBindRenderbuffer(testCtx,0x8d41,renderbufferID);
  glu::CallLogWrapper::glRenderbufferStorage(testCtx,0x8d41,0x8051,0x80,0x80);
  ApiCase::expectError(&this->super_ApiCase,0);
  GVar1 = renderbufferID;
  glu::CallLogWrapper::glFramebufferRenderbuffer(testCtx,0x8d40,0x8ce0,0x8d41,renderbufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  checkColorAttachmentParam
            ((anon_unknown_1 *)
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             (TestContext *)testCtx,(CallLogWrapper *)0x8210,0x2601,GVar1,in_R9D);
  glu::CallLogWrapper::glFramebufferRenderbuffer(testCtx,0x8d40,0x8ce0,0x8d41,0);
  glu::CallLogWrapper::glDeleteRenderbuffers(testCtx,1,&renderbufferID);
  renderbufferID = 0;
  glu::CallLogWrapper::glGenRenderbuffers(testCtx,1,&renderbufferID);
  glu::CallLogWrapper::glBindRenderbuffer(testCtx,0x8d41,renderbufferID);
  glu::CallLogWrapper::glRenderbufferStorage(testCtx,0x8d41,0x8c43,0x80,0x80);
  ApiCase::expectError(&this->super_ApiCase,0);
  GVar1 = renderbufferID;
  glu::CallLogWrapper::glFramebufferRenderbuffer(testCtx,0x8d40,0x8ce0,0x8d41,renderbufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  checkColorAttachmentParam
            ((anon_unknown_1 *)
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             (TestContext *)testCtx,(CallLogWrapper *)0x8210,0x8c40,GVar1,in_R9D);
  glu::CallLogWrapper::glFramebufferRenderbuffer(testCtx,0x8d40,0x8ce0,0x8d41,0);
  glu::CallLogWrapper::glDeleteRenderbuffers(testCtx,1,&renderbufferID);
  renderbufferID = 0;
  glu::CallLogWrapper::glGenRenderbuffers(testCtx,1,&renderbufferID);
  glu::CallLogWrapper::glBindRenderbuffer(testCtx,0x8d41,renderbufferID);
  glu::CallLogWrapper::glRenderbufferStorage(testCtx,0x8d41,0x81a5,0x80,0x80);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glFramebufferRenderbuffer(testCtx,0x8d40,0x8d00,0x8d41,renderbufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  checkAttachmentParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,testCtx,
             0x8d00,0x8210,0x2601,in_R9D);
  glu::CallLogWrapper::glFramebufferRenderbuffer(testCtx,0x8d40,0x8ce0,0x8d41,0);
  glu::CallLogWrapper::glDeleteRenderbuffers(testCtx,1,&renderbufferID);
  glu::CallLogWrapper::glDeleteFramebuffers(testCtx,1,&framebufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		GLuint framebufferID = 0;
		glGenFramebuffers(1, &framebufferID);
		glBindFramebuffer(GL_FRAMEBUFFER, framebufferID);
		expectError(GL_NO_ERROR);

		// rgb8 color
		{
			GLuint renderbufferID = 0;
			glGenRenderbuffers(1, &renderbufferID);
			glBindRenderbuffer(GL_RENDERBUFFER, renderbufferID);
			glRenderbufferStorage(GL_RENDERBUFFER, GL_RGB8, 128, 128);
			expectError(GL_NO_ERROR);

			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, renderbufferID);
			expectError(GL_NO_ERROR);

			checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING, GL_LINEAR);

			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, 0);
			glDeleteRenderbuffers(1, &renderbufferID);
		}

		// srgb8_alpha8 color
		{
			GLuint renderbufferID = 0;
			glGenRenderbuffers(1, &renderbufferID);
			glBindRenderbuffer(GL_RENDERBUFFER, renderbufferID);
			glRenderbufferStorage(GL_RENDERBUFFER, GL_SRGB8_ALPHA8, 128, 128);
			expectError(GL_NO_ERROR);

			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, renderbufferID);
			expectError(GL_NO_ERROR);

			checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING, GL_SRGB);

			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, 0);
			glDeleteRenderbuffers(1, &renderbufferID);
		}

		// depth
		{
			GLuint renderbufferID = 0;
			glGenRenderbuffers(1, &renderbufferID);
			glBindRenderbuffer(GL_RENDERBUFFER, renderbufferID);
			glRenderbufferStorage(GL_RENDERBUFFER, GL_DEPTH_COMPONENT16, 128, 128);
			expectError(GL_NO_ERROR);

			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, renderbufferID);
			expectError(GL_NO_ERROR);

			checkAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING, GL_LINEAR);

			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, 0);
			glDeleteRenderbuffers(1, &renderbufferID);
		}

		glDeleteFramebuffers(1, &framebufferID);
		expectError(GL_NO_ERROR);
	}